

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall stream_buffer::pop_front(stream_buffer *this,int size)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  value_type tmp;
  
  if (size - 1U < 9) {
    sVar3 = (this->buffer_ptr)._M_elems[0]._M_len;
    pcVar4 = (this->buffer_ptr)._M_elems[0]._M_str;
    pbVar1 = (this->buffer_ptr)._M_elems + (uint)size;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 1;
    if (8 < (uint)size) {
      uVar2 = size - 9;
    }
    (this->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[0]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 2;
    if (7 < (uint)size) {
      uVar2 = size - 8;
    }
    (this->buffer_ptr)._M_elems[1]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[1]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 3;
    if (6 < (uint)size) {
      uVar2 = size - 7;
    }
    (this->buffer_ptr)._M_elems[2]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[2]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 4;
    if (5 < (uint)size) {
      uVar2 = size - 6;
    }
    (this->buffer_ptr)._M_elems[3]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[3]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 5;
    if (4 < (uint)size) {
      uVar2 = size - 5;
    }
    (this->buffer_ptr)._M_elems[4]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[4]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 6;
    if (3 < (uint)size) {
      uVar2 = size - 4;
    }
    (this->buffer_ptr)._M_elems[5]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[5]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 7;
    if (2 < (uint)size) {
      uVar2 = size - 3;
    }
    (this->buffer_ptr)._M_elems[6]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[6]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    uVar2 = size + 8;
    if (1 < (uint)size) {
      uVar2 = size - 2;
    }
    (this->buffer_ptr)._M_elems[7]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[7]._M_str = pcVar5;
    pbVar1 = (this->buffer_ptr)._M_elems + uVar2;
    pcVar5 = pbVar1->_M_str;
    (this->buffer_ptr)._M_elems[8]._M_len = pbVar1->_M_len;
    (this->buffer_ptr)._M_elems[8]._M_str = pcVar5;
    (this->buffer_ptr)._M_elems[9]._M_len = sVar3;
    (this->buffer_ptr)._M_elems[9]._M_str = pcVar4;
    do_push_back(this,size);
    return;
  }
  pop_front();
}

Assistant:

void pop_front(int size)
    {
        bx_expects(size >= 1 && size < stream_buffer_size);

        auto tmp = buffer_ptr[0];

        buffer_ptr[0] = buffer_ptr[(size + 0) % stream_buffer_size];
        buffer_ptr[1] = buffer_ptr[(size + 1) % stream_buffer_size];
        buffer_ptr[2] = buffer_ptr[(size + 2) % stream_buffer_size];
        buffer_ptr[3] = buffer_ptr[(size + 3) % stream_buffer_size];
        buffer_ptr[4] = buffer_ptr[(size + 4) % stream_buffer_size];
        buffer_ptr[5] = buffer_ptr[(size + 5) % stream_buffer_size];
        buffer_ptr[6] = buffer_ptr[(size + 6) % stream_buffer_size];
        buffer_ptr[7] = buffer_ptr[(size + 7) % stream_buffer_size];
        buffer_ptr[8] = buffer_ptr[(size + 8) % stream_buffer_size];
        buffer_ptr[9] = tmp;

        do_push_back(size);
    }